

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

int __thiscall ncnn::Gemm_x86::create_pipeline(Gemm_x86 *this,Option *opt)

{
  Mat *pMVar1;
  Mat *dst;
  size_t sVar2;
  Allocator *pAVar3;
  void *pvVar4;
  int max_kk;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int max_ii;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  Mat local_a8;
  int local_58;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Option *local_48;
  ulong local_40;
  ulong local_38;
  
  if ((this->super_Gemm).int8_scale_term != 0) {
    iVar5 = create_pipeline_int8(this,opt);
    return iVar5;
  }
  local_48 = opt;
  if ((this->super_Gemm).constantA == 0) {
LAB_00435787:
    if ((this->super_Gemm).constantB != 0) {
      iVar5 = (this->super_Gemm).constantN;
      iVar11 = (this->super_Gemm).constantK;
      get_optimal_tile_mnk
                (0,iVar5,iVar11,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,opt->num_threads);
      iVar12 = (TILE_N + iVar5 + -1) / TILE_N;
      iVar9 = (iVar11 + TILE_K + -1) / TILE_K;
      Mat::create(&this->BT_data,TILE_K * TILE_N,iVar9,iVar12,4,(Allocator *)0x0);
      if (((this->BT_data).data == (void *)0x0) ||
         ((long)(this->BT_data).c * (this->BT_data).cstep == 0)) goto LAB_00435961;
      iVar12 = iVar12 * iVar9;
      pMVar1 = &(this->super_Gemm).B_data;
      iVar14 = 0;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      for (; opt = local_48, iVar12 != iVar14; iVar14 = iVar14 + 1) {
        iVar10 = TILE_N * (iVar14 / iVar9);
        iVar13 = TILE_K * (int)((long)iVar14 % (long)iVar9);
        iVar16 = iVar5 - iVar10;
        if (TILE_N < iVar5 - iVar10) {
          iVar16 = TILE_N;
        }
        max_kk = iVar11 - iVar13;
        if (TILE_K < iVar11 - iVar13) {
          max_kk = TILE_K;
        }
        local_a8.w = (this->BT_data).w;
        local_a8.cstep = (size_t)local_a8.w;
        sVar2 = (this->BT_data).elemsize;
        local_a8.elempack = (this->BT_data).elempack;
        local_a8.data =
             (void *)((long)(this->BT_data).data +
                     ((long)iVar14 % (long)iVar9 & 0xffffffffU) * local_a8.cstep * sVar2 +
                     (long)(iVar14 / iVar9) * (this->BT_data).cstep * sVar2);
        local_a8.allocator = (this->BT_data).allocator;
        local_a8.refcount._0_4_ = 0;
        local_a8.refcount._4_4_ = 0;
        local_a8.elemsize._0_4_ = (undefined4)sVar2;
        local_a8.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
        local_a8.dims = 2;
        local_a8.h = 1;
        local_a8.d = 1;
        local_a8.c = 1;
        if ((this->super_Gemm).transB == 0) {
          transpose_pack_B_tile(pMVar1,&local_a8,iVar10,iVar16,iVar13,max_kk);
        }
        else {
          pack_B_tile(pMVar1,&local_a8,iVar10,iVar16,iVar13,max_kk);
        }
      }
      if (local_48->lightmode != false) {
        piVar8 = (this->super_Gemm).B_data.refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pAVar3 = (this->super_Gemm).B_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              free((this->super_Gemm).B_data.data);
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Gemm).B_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Gemm).B_data.elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->super_Gemm).B_data.refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
    }
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar8 = (this->super_Gemm).C_data.refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->CT_data).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar3 = (this->CT_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            free((this->CT_data).data);
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      pMVar1 = &(this->super_Gemm).C_data;
      dst = &this->CT_data;
      piVar8 = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (this->super_Gemm).C_data.data;
      (this->CT_data).refcount = piVar8;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar5 = (this->super_Gemm).C_data.w;
      iVar11 = (this->super_Gemm).C_data.h;
      iVar12 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar5;
      (this->CT_data).h = iVar11;
      (this->CT_data).d = iVar12;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (((this->super_Gemm).constant_broadcast_type_C == 3) && (opt->use_packing_layout == true))
      {
        convert_packing(pMVar1,dst,(uint)(((this->super_Gemm).constantM & 3) == 0) * 3 + 1,opt);
      }
      if ((this->super_Gemm).beta != 1.0) {
        local_a8.cstep = 0;
        local_a8.data = (void *)0x0;
        local_a8.refcount._0_4_ = 0;
        local_a8.refcount._4_4_ = 0;
        local_a8.elemsize._0_4_ = 0;
        local_a8.elemsize._4_4_ = 0;
        local_a8.elempack = 0;
        local_a8.allocator = (Allocator *)0x0;
        local_a8.dims = 0;
        local_a8.w = 0;
        local_a8.h = 0;
        local_a8.d = 0;
        local_a8.c = 0;
        uVar15 = 0;
        Mat::create_like(&local_a8,dst,(Allocator *)0x0);
        uVar6 = (this->CT_data).c * (int)(this->CT_data).cstep * (this->CT_data).elempack;
        pvVar4 = (this->CT_data).data;
        uVar7 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar7 = uVar15;
        }
        for (; uVar7 != uVar15; uVar15 = uVar15 + 1) {
          *(float *)((long)local_a8.data + uVar15 * 4) =
               (this->super_Gemm).beta * *(float *)((long)pvVar4 + uVar15 * 4);
        }
        piVar8 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
        if (dst != &local_a8) {
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          piVar8 = (this->CT_data).refcount;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              pAVar3 = (this->CT_data).allocator;
              if (pAVar3 == (Allocator *)0x0) {
                free((this->CT_data).data);
              }
              else {
                (*pAVar3->_vptr_Allocator[3])();
              }
            }
          }
          (this->CT_data).data = local_a8.data;
          piVar8 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
          (this->CT_data).refcount = piVar8;
          (this->CT_data).elemsize = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize)
          ;
          (this->CT_data).elempack = local_a8.elempack;
          (this->CT_data).allocator = local_a8.allocator;
          (this->CT_data).dims = local_a8.dims;
          (this->CT_data).w = local_a8.w;
          (this->CT_data).h = local_a8.h;
          (this->CT_data).d = local_a8.d;
          (this->CT_data).c = local_a8.c;
          (this->CT_data).cstep = local_a8.cstep;
        }
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_a8.allocator == (Allocator *)0x0) {
              free(local_a8.data);
            }
            else {
              (*(local_a8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      if (opt->lightmode == true) {
        piVar8 = (this->super_Gemm).C_data.refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pAVar3 = (this->super_Gemm).C_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              free((this->super_Gemm).C_data.data);
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Gemm).C_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Gemm).C_data.elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    iVar5 = 0;
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       ((this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = opt->num_threads;
    }
  }
  else {
    uVar6 = (this->super_Gemm).constantM;
    iVar5 = (this->super_Gemm).constantK;
    get_optimal_tile_mnk
              (uVar6,0,iVar5,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar12 = TILE_K;
    local_40 = (ulong)(uint)TILE_M;
    iVar11 = (int)(uVar6 + TILE_M + -1) / TILE_M;
    local_38 = (ulong)uVar6;
    Mat::create(&this->AT_data,TILE_K * TILE_M,(TILE_K + iVar5 + -1) / TILE_K,iVar11,4,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      pMVar1 = &(this->super_Gemm).A_data;
      iVar9 = 0;
      local_58 = iVar11;
      if (iVar11 < 1) {
        local_58 = 0;
      }
      for (; opt = local_48, iVar9 != local_58; iVar9 = iVar9 + 1) {
        iVar14 = (int)local_40;
        iVar16 = iVar14 * iVar9;
        iVar11 = (int)local_38 - iVar16;
        if (iVar14 < iVar11) {
          iVar11 = iVar14;
        }
        iVar14 = iVar5;
        for (iVar10 = 0; iVar10 < iVar5; iVar10 = iVar10 + iVar12) {
          iVar13 = iVar14;
          if (iVar12 < iVar14) {
            iVar13 = iVar12;
          }
          sVar2 = (this->AT_data).elemsize;
          local_a8.w = (this->AT_data).w;
          local_a8.cstep = (size_t)local_a8.w;
          local_a8.elempack = (this->AT_data).elempack;
          local_a8.allocator = (this->AT_data).allocator;
          local_a8.data =
               (void *)((long)(this->AT_data).data +
                       sVar2 * local_a8.cstep * (long)(iVar10 / iVar12) +
                       (this->AT_data).cstep * (long)iVar9 * sVar2);
          local_a8.refcount._0_4_ = 0;
          local_a8.refcount._4_4_ = 0;
          local_a8.elemsize._0_4_ = (undefined4)sVar2;
          local_a8.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
          local_a8.dims = 2;
          local_a8.h = 1;
          local_a8.d = 1;
          local_a8.c = 1;
          if ((this->super_Gemm).transA == 0) {
            pack_A_tile(pMVar1,&local_a8,iVar16,iVar11,iVar10,iVar13);
          }
          else {
            transpose_pack_A_tile(pMVar1,&local_a8,iVar16,iVar11,iVar10,iVar13);
          }
          iVar14 = iVar14 - iVar12;
        }
      }
      if (local_48->lightmode != false) {
        piVar8 = (this->super_Gemm).A_data.refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pAVar3 = (this->super_Gemm).A_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              free((this->super_Gemm).A_data.data);
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Gemm).A_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Gemm).A_data.elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->super_Gemm).A_data.refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      goto LAB_00435787;
    }
LAB_00435961:
    iVar5 = -100;
  }
  return iVar5;
}

Assistant:

int Gemm_x86::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}